

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O3

void __thiscall llvm::FoldingSetIteratorImpl::advance(FoldingSetIteratorImpl *this)

{
  ulong *puVar1;
  FoldingSetNode *pFVar2;
  
  pFVar2 = (FoldingSetNode *)this->NodePtr->NextInFoldingSetBucket;
  if (pFVar2 == (FoldingSetNode *)0x0 || ((ulong)pFVar2 & 1) != 0) {
    if (((ulong)pFVar2 & 1) == 0) {
      __assert_fail("(Ptr & 1) && \"Not a bucket pointer\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/FoldingSet.cpp"
                    ,0xcb,"void **GetBucketPtr(void *)");
    }
    puVar1 = (ulong *)((ulong)pFVar2 & 0xfffffffffffffffe);
    do {
      do {
        puVar1 = puVar1 + 1;
        pFVar2 = (FoldingSetNode *)*puVar1;
      } while (pFVar2 == (FoldingSetNode *)0x0);
    } while ((pFVar2 != (FoldingSetNode *)0xffffffffffffffff) &&
            (pFVar2 == (FoldingSetNode *)0x0 || ((ulong)pFVar2 & 1) != 0));
  }
  this->NodePtr = pFVar2;
  return;
}

Assistant:

void FoldingSetIteratorImpl::advance() {
  // If there is another link within this bucket, go to it.
  void *Probe = NodePtr->getNextInBucket();

  if (FoldingSetNode *NextNodeInBucket = GetNextPtr(Probe))
    NodePtr = NextNodeInBucket;
  else {
    // Otherwise, this is the last link in this bucket.
    void **Bucket = GetBucketPtr(Probe);

    // Skip to the next non-null non-self-cycle bucket.
    do {
      ++Bucket;
    } while (*Bucket != reinterpret_cast<void*>(-1) &&
             (!*Bucket || !GetNextPtr(*Bucket)));

    NodePtr = static_cast<FoldingSetNode*>(*Bucket);
  }
}